

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_flat_file.c
# Opt level: O1

void test_flat_file_sort_get_many_nonexist(planck_unit_test_t *tc)

{
  ion_flat_file_t flat_file;
  undefined4 local_bc;
  undefined4 local_b8;
  undefined4 local_b4;
  undefined4 local_b0;
  undefined4 local_ac;
  undefined4 local_a8;
  undefined4 local_a4;
  undefined4 local_a0;
  undefined4 local_9c;
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_90;
  undefined4 local_8c;
  ion_flat_file_t local_88;
  
  ftest_create(tc,&local_88,key_type_numeric_signed,4,4,0xf);
  local_88.sorted_mode = '\x01';
  local_8c = 0x11;
  local_90 = 0x11;
  ftest_insert(tc,&local_88,&local_8c,&local_90,'\0',1,'\x01');
  local_94 = 0x2d;
  local_98 = 0x11;
  ftest_insert(tc,&local_88,&local_94,&local_98,'\0',1,'\x01');
  local_9c = 0x3f;
  local_a0 = 0x11;
  ftest_insert(tc,&local_88,&local_9c,&local_a0,'\0',1,'\x01');
  local_a4 = 0x40;
  local_a8 = 0x11;
  ftest_insert(tc,&local_88,&local_a4,&local_a8,'\0',1,'\x01');
  local_ac = 99;
  local_b0 = 0x11;
  ftest_insert(tc,&local_88,&local_ac,&local_b0,'\0',1,'\x01');
  local_b4 = 0x67;
  local_b8 = 0x11;
  ftest_insert(tc,&local_88,&local_b4,&local_b8,'\0',1,'\x01');
  local_bc = 0x21;
  ftest_get(tc,&local_88,&local_bc,'\x01',(ion_value_t)0x0);
  ftest_destroy(tc,&local_88);
  return;
}

Assistant:

void
test_flat_file_sort_get_many_nonexist(
	planck_unit_test_t *tc
) {
	ion_flat_file_t flat_file;

	ftest_setup_sorted(tc, &flat_file);

	ftest_insert(tc, &flat_file, IONIZE(17, int), IONIZE(17, int), err_ok, 1, boolean_true);
	ftest_insert(tc, &flat_file, IONIZE(45, int), IONIZE(17, int), err_ok, 1, boolean_true);
	ftest_insert(tc, &flat_file, IONIZE(63, int), IONIZE(17, int), err_ok, 1, boolean_true);
	ftest_insert(tc, &flat_file, IONIZE(64, int), IONIZE(17, int), err_ok, 1, boolean_true);
	ftest_insert(tc, &flat_file, IONIZE(99, int), IONIZE(17, int), err_ok, 1, boolean_true);
	ftest_insert(tc, &flat_file, IONIZE(103, int), IONIZE(17, int), err_ok, 1, boolean_true);

	ftest_get(tc, &flat_file, IONIZE(33, int), err_item_not_found, NULL);

	ftest_takedown(tc, &flat_file);
}